

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

int rs_read_object_reference
              (FILE *inf,list<ItemThing_*,_std::allocator<ItemThing_*>_> *list,ItemThing **item)

{
  ItemThing *pIVar1;
  bool local_2e;
  bool local_2d;
  int local_2c;
  ItemThing **ppIStack_28;
  int i;
  ItemThing **item_local;
  list<ItemThing_*,_std::allocator<ItemThing_*>_> *list_local;
  FILE *inf_local;
  
  if ((read_error == 0) && (format_error == 0)) {
    ppIStack_28 = item;
    item_local = (ItemThing **)list;
    list_local = (list<ItemThing_*,_std::allocator<ItemThing_*>_> *)inf;
    rs_read_int(inf,&local_2c);
    pIVar1 = get_list_item((list<ItemThing_*,_std::allocator<ItemThing_*>_> *)item_local,local_2c);
    *ppIStack_28 = pIVar1;
    local_2e = format_error != 0 || read_error != 0;
    local_2d = local_2e;
  }
  else {
    local_2d = format_error != 0 || read_error != 0;
  }
  inf_local._4_4_ = (uint)local_2d;
  return inf_local._4_4_;
}

Assistant:

static int rs_read_object_reference(FILE *inf, std::list<ItemThing*>& list, ItemThing **item)
{
    int i;
    
    if (read_error || format_error)
        return(READSTAT);

    rs_read_int(inf, &i);

    *item = get_list_item(list, i);
            
    return(READSTAT);
}